

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceDecomposition::fillPreForceData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  reference pvVar1;
  reference pvVar2;
  int in_EDX;
  value_type *in_RSI;
  Vector<double,_7U> *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI[1].data_ + 5),(long)in_EDX);
  *in_RSI = *pvVar1;
  Vector<double,_7U>::operator=
            ((Vector<double,_7U> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RDI);
  Vector<double,_7U>::operator=
            ((Vector<double,_7U> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RDI);
  if (((ulong)in_RDI->data_[6] & 0x80) != 0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI->data_[3] + 0xa8),
                        (long)in_EDX);
    *(value_type *)(in_RSI + 0x16) = *pvVar2;
  }
  if (((ulong)in_RDI->data_[6] & 0x40) != 0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI->data_[3] + 0x90),
                        (long)in_EDX);
    *(value_type *)(in_RSI + 0x14) = *pvVar2;
  }
  return;
}

Assistant:

void ForceDecomposition::fillPreForceData(SelfData& sdat, int atom) {
    sdat.atid    = idents[atom];
    sdat.selfPot = selfPot;
    sdat.selePot = selectedSelfPot;

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      sdat.rho = snap_->atomData.density[atom];
    }

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      sdat.particlePot = snap_->atomData.particlePot[atom];
    }
  }